

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtree.cpp
# Opt level: O0

void __thiscall libDAI::JTree::runHUGIN(JTree *this)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  TFactor<double> *pTVar4;
  reference pvVar5;
  TFactor<double> *pTVar6;
  size_type __n;
  long *in_RDI;
  double dVar7;
  size_t alpha_1;
  Factor new_Qb_1;
  size_t i_1;
  Factor new_Qb;
  size_t i;
  size_t beta;
  size_t alpha;
  undefined4 in_stack_fffffffffffffe58;
  NormType in_stack_fffffffffffffe5c;
  RegionGraph *in_stack_fffffffffffffe60;
  TFactor<double> *pTVar8;
  vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *in_stack_fffffffffffffe70;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *this_00;
  TFactor<double> *in_stack_fffffffffffffe80;
  TFactor<double> *in_stack_fffffffffffffe88;
  TFactor<double> *in_stack_fffffffffffffeb8;
  FRegion *in_stack_fffffffffffffec8;
  TFactor<double> *local_120;
  VarSet *in_stack_ffffffffffffff00;
  TFactor<double> *in_stack_ffffffffffffff08;
  TFactor<double> local_e0;
  TFactor<double> *local_a8;
  size_type local_20;
  TFactor<double> *local_18;
  ulong local_10;
  
  local_10 = 0;
  while( true ) {
    uVar1 = local_10;
    (**(code **)(*in_RDI + 0x28))();
    sVar3 = RegionGraph::nr_ORs((RegionGraph *)0xb63c4e);
    if (sVar3 <= uVar1) break;
    (**(code **)(*in_RDI + 0x28))();
    in_stack_fffffffffffffec8 =
         RegionGraph::OR(in_stack_fffffffffffffe60,
                         CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               (in_RDI + 0x42),local_10);
    TFactor<double>::operator=
              ((TFactor<double> *)in_stack_fffffffffffffe60,
               (TFactor<double> *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    local_10 = local_10 + 1;
  }
  local_18 = (TFactor<double> *)0x0;
  while( true ) {
    pTVar8 = local_18;
    (**(code **)(*in_RDI + 0x28))();
    pTVar4 = (TFactor<double> *)RegionGraph::nr_IRs((RegionGraph *)0xb63cef);
    if (pTVar4 <= pTVar8) break;
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               (in_RDI + 0x45),(size_type)local_18);
    TFactor<double>::fill
              ((TFactor<double> *)in_stack_fffffffffffffe60,
               (double)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    local_18 = (TFactor<double> *)
               ((long)&(local_18->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  in_RDI[0x4b] = 0;
  local_20 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::size
                       ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)(in_RDI + 0x3f));
  while (__n = local_20 - 1, local_20 != 0) {
    local_20 = __n;
    pvVar5 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                       ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)(in_RDI + 0x3f),__n
                       );
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               (in_RDI + 0x42),pvVar5->n2);
    (**(code **)(*in_RDI + 0x28))();
    RegionGraph::IR(in_stack_fffffffffffffe60,
                    CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    TFactor<double>::partSum(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    in_stack_fffffffffffffeb8 =
         (TFactor<double> *)
         TFactor<double>::normalize
                   ((TFactor<double> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    dVar7 = log((double)in_stack_fffffffffffffeb8);
    in_RDI[0x4b] = (long)((double)in_RDI[0x4b] + dVar7);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               (in_RDI + 0x45),local_20);
    TFactor<double>::divided_by(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    pvVar5 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                       ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)(in_RDI + 0x3f),
                        local_20);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               (in_RDI + 0x42),pvVar5->n1);
    TFactor<double>::operator*=(pTVar8,in_stack_fffffffffffffeb8);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffe60);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               (in_RDI + 0x45),local_20);
    TFactor<double>::operator=
              ((TFactor<double> *)in_stack_fffffffffffffe60,
               (TFactor<double> *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffe60);
  }
  local_20 = __n;
  bVar2 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::empty
                    (in_stack_fffffffffffffe70);
  if (bVar2) {
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               (in_RDI + 0x42),0);
    dVar7 = TFactor<double>::normalize
                      ((TFactor<double> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    dVar7 = log(dVar7);
    in_RDI[0x4b] = (long)(dVar7 + (double)in_RDI[0x4b]);
  }
  else {
    pvVar5 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                       ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)(in_RDI + 0x3f),0);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               (in_RDI + 0x42),pvVar5->n1);
    dVar7 = TFactor<double>::normalize
                      ((TFactor<double> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    dVar7 = log(dVar7);
    in_RDI[0x4b] = (long)(dVar7 + (double)in_RDI[0x4b]);
  }
  local_a8 = (TFactor<double> *)0x0;
  while( true ) {
    pTVar4 = local_a8;
    pTVar6 = (TFactor<double> *)
             std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::size
                       ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)(in_RDI + 0x3f));
    if (pTVar6 <= pTVar4) break;
    this_00 = (vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
              (in_RDI + 0x42);
    pvVar5 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                       ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)(in_RDI + 0x3f),
                        (size_type)local_a8);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              (this_00,pvVar5->n1);
    (**(code **)(*in_RDI + 0x28))();
    RegionGraph::IR(in_stack_fffffffffffffe60,
                    CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    pTVar6 = &local_e0;
    TFactor<double>::marginal
              (&in_stack_fffffffffffffec8->super_Factor,&pTVar8->_vs,
               SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               (in_RDI + 0x45),(size_type)local_a8);
    TFactor<double>::divided_by(pTVar4,pTVar6);
    pvVar5 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                       ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)(in_RDI + 0x3f),
                        (size_type)local_a8);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               (in_RDI + 0x42),pvVar5->n2);
    TFactor<double>::operator*=(pTVar8,in_stack_fffffffffffffeb8);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffe60);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               (in_RDI + 0x45),(size_type)local_a8);
    TFactor<double>::operator=
              ((TFactor<double> *)in_stack_fffffffffffffe60,
               (TFactor<double> *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffe60);
    local_a8 = (TFactor<double> *)
               ((long)&(local_a8->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  local_120 = (TFactor<double> *)0x0;
  while( true ) {
    pTVar8 = local_120;
    (**(code **)(*in_RDI + 0x28))();
    pTVar4 = (TFactor<double> *)RegionGraph::nr_ORs((RegionGraph *)0xb64210);
    if (pTVar4 <= pTVar8) break;
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               (in_RDI + 0x42),(size_type)local_120);
    TFactor<double>::normalize(pTVar8,in_stack_fffffffffffffe5c);
    local_120 = (TFactor<double> *)
                ((long)&(local_120->_vs)._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start + 1);
  }
  return;
}

Assistant:

void JTree::runHUGIN() {
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
            _Qa[alpha] = grm().OR(alpha);

        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
            _Qb[beta].fill( 1.0 );

        // CollectEvidence
        _logZ = 0.0;
        for( size_t i = _RTree.size(); (i--) != 0; ) {
    //      Make outer region _RTree[i].n1 consistent with outer region _RTree[i].n2
    //      IR(i) = seperator OR(_RTree[i].n1) && OR(_RTree[i].n2)
            Factor new_Qb = _Qa[_RTree[i].n2].partSum( grm().IR( i ) );
            _logZ += log(new_Qb.normalize());
            _Qa[_RTree[i].n1] *= new_Qb.divided_by( _Qb[i] ); 
            _Qb[i] = new_Qb;
        }
        if( _RTree.empty() )
            _logZ += log(_Qa[0].normalize() );
        else
            _logZ += log(_Qa[_RTree[0].n1].normalize());

        // DistributeEvidence
        for( size_t i = 0; i < _RTree.size(); i++ ) {
    //      Make outer region _RTree[i].n2 consistent with outer region _RTree[i].n1
    //      IR(i) = seperator OR(_RTree[i].n1) && OR(_RTree[i].n2)
            Factor new_Qb = _Qa[_RTree[i].n1].marginal( grm().IR( i ) );
            _Qa[_RTree[i].n2] *= new_Qb.divided_by( _Qb[i] ); 
            _Qb[i] = new_Qb;
        }

        // Normalize
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
            _Qa[alpha].normalize();
    }